

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDVertex::EdgeArrayIndex(ON_SubDVertex *this,ON_SubDEdge *edge)

{
  uint local_34;
  ON_SubDEdgePtr *pOStack_30;
  uint i;
  ON_SubDEdgePtr *eptr;
  uint edge_count;
  ON_SubDEdge *edge_local;
  ON_SubDVertex *this_local;
  
  if ((edge != (ON_SubDEdge *)0x0) && (this->m_edge_count != 0)) {
    pOStack_30 = this->m_edges;
    if (pOStack_30 == (ON_SubDEdgePtr *)0x0) {
      ON_SubDIncrementErrorCount();
    }
    else {
      for (local_34 = 0; local_34 < this->m_edge_count; local_34 = local_34 + 1) {
        if (edge == (ON_SubDEdge *)(pOStack_30->m_ptr & 0xfffffffffffffff8)) {
          return local_34;
        }
        pOStack_30 = pOStack_30 + 1;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDVertex::EdgeArrayIndex(
  const ON_SubDEdge* edge
  ) const
{
  if ( nullptr == edge )
    return ON_UNSET_UINT_INDEX;
  const unsigned int edge_count = m_edge_count;
  if ( 0 == edge_count)
    return ON_UNSET_UINT_INDEX;
  const ON_SubDEdgePtr* eptr = m_edges;
  if ( nullptr == eptr)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_UINT_INDEX);

  for ( unsigned int i = 0; i < edge_count; i++, eptr++)
  {
    if (edge == ON_SUBD_EDGE_POINTER(eptr->m_ptr))
      return i;
  }

  return ON_UNSET_UINT_INDEX;
}